

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

bool __thiscall
branch_and_reduce_algorithm::folded_vertices_exist(branch_and_reduce_algorithm *this)

{
  long *plVar1;
  int *piVar2;
  vector<int,_std::allocator<int>_> *__range1;
  int iVar3;
  long lVar4;
  bool bVar5;
  vector<int,_std::allocator<int>_> x2;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_38,&this->x);
  iVar3 = this->modifiedN + 1;
  lVar4 = (ulong)(uint)this->modifiedN << 4;
  while( true ) {
    iVar3 = iVar3 + -1;
    if (iVar3 < 1) break;
    plVar1 = *(long **)((long)&(this->modifieds).
                               super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].
                               super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       lVar4);
    (**(code **)(*plVar1 + 0x18))(plVar1,&local_38);
    lVar4 = lVar4 + -0x10;
  }
  bVar5 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish;
  if (bVar5) {
    iVar3 = *local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    while (iVar3 != 2) {
      piVar2 = piVar2 + 1;
      bVar5 = piVar2 != local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      if (piVar2 == local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
      iVar3 = *piVar2;
    }
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool branch_and_reduce_algorithm::folded_vertices_exist() const
{

    std::vector<int> x2(x);

    for (int i = modifiedN - 1; i >= 0; i--)
    {
        modifieds[i]->reverse(x2);
    }

    for (int const i : x2)
    {
        if (i == 2)
            return true;
    }

    return false;
}